

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O0

void UI::execute_simple_merge(int *argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  ostream *poVar3;
  allocator<char> local_5c1;
  string local_5c0;
  allocator<char> local_599;
  string local_598;
  allocator<char> local_571;
  string local_570;
  allocator<char> local_549;
  string local_548;
  allocator<char> local_521;
  string local_520;
  string local_500;
  allocator<char> local_4d9;
  string local_4d8 [8];
  string export_path;
  string local_4b0;
  allocator<char> local_489;
  string local_488;
  allocator<char> local_461;
  string local_460;
  allocator<char> local_439;
  string local_438;
  undefined1 local_408 [8];
  geofile secondary_geofile;
  geofile primary_geofile;
  char **argv_local;
  int *argc_local;
  
  if (*argc == 6) {
    GEO::geofile::geofile
              ((geofile *)
               &secondary_geofile.physical_volumes_map._M_t._M_impl.super__Rb_tree_header.
                _M_node_count);
    GEO::geofile::geofile((geofile *)local_408);
    pcVar1 = argv[3];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,pcVar1,&local_439);
    iVar2 = GEO::geofile::import_geofile
                      ((geofile *)
                       &secondary_geofile.physical_volumes_map._M_t._M_impl.super__Rb_tree_header.
                        _M_node_count,&local_438);
    std::__cxx11::string::~string((string *)&local_438);
    std::allocator<char>::~allocator(&local_439);
    if (iVar2 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_460,"Imported primary geometry file successfully.",&local_461);
      print_ln(&local_460);
      std::__cxx11::string::~string((string *)&local_460);
      std::allocator<char>::~allocator(&local_461);
      pcVar1 = argv[4];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,pcVar1,&local_489);
      iVar2 = GEO::geofile::import_geofile((geofile *)local_408,&local_488);
      std::__cxx11::string::~string((string *)&local_488);
      std::allocator<char>::~allocator(&local_489);
      if (iVar2 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4b0,"Imported secondary geometry file successfully.",
                   (allocator<char> *)(export_path.field_2._M_local_buf + 0xf));
        print_ln(&local_4b0);
        std::__cxx11::string::~string((string *)&local_4b0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(export_path.field_2._M_local_buf + 0xf));
        iVar2 = GEO::geofile::merge_with
                          ((geofile *)
                           &secondary_geofile.physical_volumes_map._M_t._M_impl.
                            super__Rb_tree_header._M_node_count,(geofile *)local_408);
        if (iVar2 == 0) {
          pcVar1 = argv[5];
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_4d8,pcVar1,&local_4d9);
          std::allocator<char>::~allocator(&local_4d9);
          std::__cxx11::string::string((string *)&local_500,local_4d8);
          iVar2 = GEO::geofile::export_geofile
                            ((geofile *)
                             &secondary_geofile.physical_volumes_map._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,&local_500);
          std::__cxx11::string::~string((string *)&local_500);
          if (iVar2 == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_520,"Export returned success.",&local_521);
            print_ln(&local_520);
            std::__cxx11::string::~string((string *)&local_520);
            std::allocator<char>::~allocator(&local_521);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_548,"Export returned failure.",&local_549);
            print_ln(&local_548);
            std::__cxx11::string::~string((string *)&local_548);
            std::allocator<char>::~allocator(&local_549);
          }
          std::__cxx11::string::~string(local_4d8);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_570,"Error: Merge Operation Failed.",&local_571);
          print_ln(&local_570);
          std::__cxx11::string::~string((string *)&local_570);
          std::allocator<char>::~allocator(&local_571);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_598,"Error: Import of second file failed.",&local_599);
        print_ln(&local_598);
        std::__cxx11::string::~string((string *)&local_598);
        std::allocator<char>::~allocator(&local_599);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5c0,"Error: Import of first file failed.",&local_5c1);
      print_ln(&local_5c0);
      std::__cxx11::string::~string((string *)&local_5c0);
      std::allocator<char>::~allocator(&local_5c1);
    }
    GEO::geofile::~geofile((geofile *)local_408);
    GEO::geofile::~geofile
              ((geofile *)
               &secondary_geofile.physical_volumes_map._M_t._M_impl.super__Rb_tree_header.
                _M_node_count);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Error: Expected 5 arguments, got ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*argc);
    poVar3 = std::operator<<(poVar3,".");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void UI::execute_simple_merge(int &argc, char *argv[])
{
    if ( argc == 6 )
    {
        GEO::geofile primary_geofile, secondary_geofile;
        if ( primary_geofile.import_geofile(argv[3]) == EXIT_SUCCESS )
        {
            print_ln("Imported primary geometry file successfully.");
            if(secondary_geofile.import_geofile(argv[4]) == EXIT_SUCCESS)
            {
                print_ln("Imported secondary geometry file successfully.");
                if (primary_geofile.merge_with(secondary_geofile)==EXIT_SUCCESS)
                {
                    std::string export_path = argv[5];
                    if(primary_geofile.export_geofile(export_path)==EXIT_SUCCESS)
                        print_ln("Export returned success.");
                    else
                        print_ln("Export returned failure.");
                }
                else
                {
                    print_ln("Error: Merge Operation Failed.");
                }
            }
            else
            {
                print_ln("Error: Import of second file failed.");
            }
        }
        else
        {
            print_ln("Error: Import of first file failed.");
        }
    }
    else
    {
        std::cout << "Error: Expected 5 arguments, got " << argc << "." << std::endl;
    }

}